

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_u8.c
# Opt level: O3

int image_u8_write_pnm(image_u8_t *im,char *path)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  int iVar3;
  
  __stream = fopen(path,"wb");
  if (__stream == (FILE *)0x0) {
    iVar3 = -1;
  }
  else {
    iVar3 = 0;
    fprintf(__stream,"P5\n%d %d\n255\n",(ulong)(uint)im->width,(ulong)(uint)im->height);
    if (0 < im->height) {
      iVar3 = 0;
      do {
        iVar1 = im->width;
        sVar2 = fwrite(im->buf + (long)iVar3 * (long)im->stride,1,(long)iVar1,__stream);
        if (sVar2 != (long)iVar1) {
          iVar3 = -2;
          goto LAB_003c8705;
        }
        iVar3 = iVar3 + 1;
      } while (iVar3 < im->height);
      iVar3 = 0;
    }
LAB_003c8705:
    fclose(__stream);
  }
  return iVar3;
}

Assistant:

int image_u8_write_pnm(const image_u8_t *im, const char *path)
{
    FILE *f = fopen(path, "wb");
    int res = 0;

    if (f == NULL) {
        res = -1;
        goto finish;
    }

    // Only outputs to grayscale
    fprintf(f, "P5\n%d %d\n255\n", im->width, im->height);

    for (int y = 0; y < im->height; y++) {
        if (im->width != fwrite(&im->buf[y*im->stride], 1, im->width, f)) {
            res = -2;
            goto finish;
        }
    }

  finish:
    if (f != NULL)
        fclose(f);

    return res;
}